

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.cpp
# Opt level: O2

void duckdb::StringSplitRegexFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  BoundFunctionExpression *pBVar2;
  pointer pFVar3;
  FunctionLocalState *pFVar4;
  reference pvVar5;
  Vector *pVVar6;
  ulong uVar7;
  idx_t iVar8;
  long lVar9;
  ulong uVar10;
  idx_t i_1;
  idx_t iVar11;
  data_ptr_t pdVar12;
  idx_t i;
  ulong uVar13;
  idx_t *piVar14;
  string_t input;
  string_t input_00;
  string_t delim;
  string_t delim_00;
  StringSplitInput local_e0;
  TemplatedValidityMask<unsigned_long> *local_c8;
  UnifiedVectorFormat input_data;
  UnifiedVectorFormat delim_data;
  
  pBVar2 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  pFVar3 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar2->bind_info);
  if (*(char *)&pFVar3[8]._vptr_FunctionData == '\x01') {
    input_data.sel = (SelectionVector *)state[1]._vptr_ExpressionState;
    pFVar4 = optional_ptr<duckdb::FunctionLocalState,_true>::operator->
                       ((optional_ptr<duckdb::FunctionLocalState,_true> *)&input_data);
    UnifiedVectorFormat::UnifiedVectorFormat(&input_data);
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
    Vector::ToUnifiedFormat(pvVar5,args->count,&input_data);
    UnifiedVectorFormat::UnifiedVectorFormat(&delim_data);
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
    Vector::ToUnifiedFormat(pvVar5,args->count,&delim_data);
    Vector::SetVectorType(result,FLAT_VECTOR);
    ListVector::SetListSize(result,0);
    pdVar12 = result->data;
    pVVar6 = ListVector::GetEntry(result);
    FlatVector::VerifyFlatVector(result);
    local_c8 = &(result->validity).super_TemplatedValidityMask<unsigned_long>;
    piVar14 = (idx_t *)(pdVar12 + 8);
    iVar11 = 0;
    for (uVar13 = 0; uVar13 < args->count; uVar13 = uVar13 + 1) {
      uVar7 = uVar13;
      if ((input_data.sel)->sel_vector != (sel_t *)0x0) {
        uVar7 = (ulong)(input_data.sel)->sel_vector[uVar13];
      }
      uVar10 = uVar13;
      if ((delim_data.sel)->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)(delim_data.sel)->sel_vector[uVar13];
      }
      if ((input_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((input_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar7 >> 6]
           >> (uVar7 & 0x3f) & 1) != 0)) {
        local_e0.result_child = pVVar6;
        local_e0.offset = iVar11;
        if ((delim_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((delim_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0)) {
          input.value.pointer.ptr = (char *)*(undefined8 *)(input_data.data + uVar7 * 0x10 + 8);
          input.value._0_8_ = *(undefined8 *)(input_data.data + uVar7 * 0x10);
          delim.value.pointer.ptr = (char *)*(undefined8 *)(delim_data.data + uVar10 * 0x10 + 8);
          delim.value._0_8_ = *(undefined8 *)(delim_data.data + uVar10 * 0x10);
          local_e0.result_list = result;
          iVar8 = StringSplitter::Split<duckdb::ConstantRegexpStringSplit>
                            (input,delim,&local_e0,pFVar4 + 1);
        }
        else {
          lVar9 = uVar7 * 0x10;
          if ((ulong)*(uint *)(input_data.data + lVar9) < 0xd) {
            pdVar12 = input_data.data + lVar9 + 4;
          }
          else {
            pdVar12 = *(data_ptr_t *)(input_data.data + lVar9 + 8);
          }
          local_e0.result_list = result;
          StringSplitInput::AddSplit
                    (&local_e0,(char *)pdVar12,(ulong)*(uint *)(input_data.data + lVar9),0);
          iVar8 = 1;
        }
        *piVar14 = iVar8;
        piVar14[-1] = iVar11;
        iVar11 = iVar11 + iVar8;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid(local_c8,uVar13);
      }
      piVar14 = piVar14 + 2;
    }
    ListVector::SetListSize(result,iVar11);
    bVar1 = DataChunk::AllConstant(args);
    if (bVar1) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
    StringVector::AddHeapReference(pVVar6,pvVar5);
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&input_data);
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
    Vector::ToUnifiedFormat(pvVar5,args->count,&input_data);
    UnifiedVectorFormat::UnifiedVectorFormat(&delim_data);
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
    Vector::ToUnifiedFormat(pvVar5,args->count,&delim_data);
    Vector::SetVectorType(result,FLAT_VECTOR);
    ListVector::SetListSize(result,0);
    pdVar12 = result->data;
    pVVar6 = ListVector::GetEntry(result);
    FlatVector::VerifyFlatVector(result);
    piVar14 = (idx_t *)(pdVar12 + 8);
    iVar11 = 0;
    for (uVar13 = 0; uVar13 < args->count; uVar13 = uVar13 + 1) {
      uVar7 = uVar13;
      if ((input_data.sel)->sel_vector != (sel_t *)0x0) {
        uVar7 = (ulong)(input_data.sel)->sel_vector[uVar13];
      }
      uVar10 = uVar13;
      if ((delim_data.sel)->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)(delim_data.sel)->sel_vector[uVar13];
      }
      if ((input_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((input_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar7 >> 6]
           >> (uVar7 & 0x3f) & 1) != 0)) {
        local_e0.result_child = pVVar6;
        local_e0.offset = iVar11;
        if ((delim_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((delim_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0)) {
          input_00.value.pointer.ptr = (char *)*(undefined8 *)(input_data.data + uVar7 * 0x10 + 8);
          input_00.value._0_8_ = *(undefined8 *)(input_data.data + uVar7 * 0x10);
          delim_00.value.pointer.ptr = (char *)*(undefined8 *)(delim_data.data + uVar10 * 0x10 + 8);
          delim_00.value._0_8_ = *(undefined8 *)(delim_data.data + uVar10 * 0x10);
          local_e0.result_list = result;
          iVar8 = StringSplitter::Split<duckdb::RegexpStringSplit>
                            (input_00,delim_00,&local_e0,(void *)0x0);
        }
        else {
          lVar9 = uVar7 * 0x10;
          if ((ulong)*(uint *)(input_data.data + lVar9) < 0xd) {
            pdVar12 = input_data.data + lVar9 + 4;
          }
          else {
            pdVar12 = *(data_ptr_t *)(input_data.data + lVar9 + 8);
          }
          local_e0.result_list = result;
          StringSplitInput::AddSplit
                    (&local_e0,(char *)pdVar12,(ulong)*(uint *)(input_data.data + lVar9),0);
          iVar8 = 1;
        }
        *piVar14 = iVar8;
        piVar14[-1] = iVar11;
        iVar11 = iVar11 + iVar8;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar13);
      }
      piVar14 = piVar14 + 2;
    }
    ListVector::SetListSize(result,iVar11);
    bVar1 = DataChunk::AllConstant(args);
    if (bVar1) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
    StringVector::AddHeapReference(pVVar6,pvVar5);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&delim_data);
  UnifiedVectorFormat::~UnifiedVectorFormat(&input_data);
  return;
}

Assistant:

static void StringSplitRegexFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RegexpMatchesBindData>();
	if (info.constant_pattern) {
		// fast path: pre-compiled regex
		auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<RegexLocalState>();
		StringSplitExecutor<ConstantRegexpStringSplit>(args, state, result, &lstate.constant_pattern);
	} else {
		// slow path: have to re-compile regex for every row
		StringSplitExecutor<RegexpStringSplit>(args, state, result);
	}
}